

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.c
# Opt level: O0

char * rtosc_match_options(char *pattern,char **msg)

{
  char *pcVar1;
  bool bVar2;
  char *preserve;
  char **msg_local;
  char *pattern_local;
  
  pcVar1 = *msg;
  pattern_local = pattern + 1;
  while( true ) {
    while( true ) {
      if ((*pattern_local == ',') || (*pattern_local == '}')) {
        while( true ) {
          bVar2 = false;
          if (*pattern_local != '\0') {
            bVar2 = *pattern_local != '}';
          }
          if (!bVar2) break;
          pattern_local = pattern_local + 1;
        }
        if (*pattern_local == '}') {
          pattern_local = pattern_local + 1;
        }
        return pattern_local;
      }
      if ((*pattern_local != **msg) || (**msg == '\0')) break;
      pattern_local = pattern_local + 1;
      *msg = *msg + 1;
    }
    *msg = pcVar1;
    while( true ) {
      bVar2 = false;
      if ((*pattern_local != '\0') && (bVar2 = false, *pattern_local != '}')) {
        bVar2 = *pattern_local != ',';
      }
      if (!bVar2) break;
      pattern_local = pattern_local + 1;
    }
    if (*pattern_local != ',') break;
    pattern_local = pattern_local + 1;
  }
  return (char *)0x0;
}

Assistant:

const char *rtosc_match_options(const char *pattern, const char **msg)
{
    const char *preserve = *msg;
    assert(*pattern == '{');
    pattern++;

retry:

    while(1) {
        //Check for special characters
        if(*pattern == ',' || *pattern == '}') {
            goto advance_until_end;
        } else if((*pattern == **msg)) { //verbatim compare
            if(**msg)
                ++pattern, ++*msg;
            else
                goto try_next;
        } else
            goto try_next;
    }

advance_until_end:
    while(*pattern && *pattern != '}') pattern++;
    if(*pattern == '}')
        pattern++;
    return pattern;
try_next:
    *msg = preserve;
    while(*pattern && *pattern != '}' && *pattern != ',') pattern++;
    if(*pattern == ',') {
        pattern++;
        goto retry;
    }

    return NULL;
}